

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O3

image<crnlib::color_quad<unsigned_char,_int>_> * __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::operator=
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,
          image<crnlib::color_quad<unsigned_char,_int>_> *other)

{
  pixel_buf_t *this_00;
  uint uVar1;
  color_quad<unsigned_char,_int> *__src;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  color_quad<unsigned_char,_int> *pcVar5;
  uint uVar6;
  size_t __n;
  
  if (this == other) {
    return this;
  }
  uVar6 = (other->m_pixel_buf).m_size;
  if (uVar6 == 0) {
    uVar6 = other->m_height * other->m_pitch;
    if ((uVar6 == 0) || (pcVar5 = other->m_pPixels, pcVar5 == (color_quad<unsigned_char,_int> *)0x0)
       ) {
      pcVar5 = (this->m_pixel_buf).m_p;
      if (pcVar5 != (color_quad<unsigned_char,_int> *)0x0) {
        crnlib_free(pcVar5);
        (this->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
        (this->m_pixel_buf).m_size = 0;
        (this->m_pixel_buf).m_capacity = 0;
      }
      pcVar5 = (color_quad<unsigned_char,_int> *)0x0;
      goto LAB_0010903c;
    }
    uVar1 = (this->m_pixel_buf).m_size;
    if (uVar1 != uVar6) {
      if ((uVar1 <= uVar6) && ((this->m_pixel_buf).m_capacity < uVar6)) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_pixel_buf,uVar6,uVar1 + 1 == uVar6,4,
                   (object_mover)0x0,false);
        pcVar5 = other->m_pPixels;
      }
      (this->m_pixel_buf).m_size = uVar6;
    }
    uVar1 = uVar6 * 2;
    if ((-1 < (int)uVar6) && ((this->m_pixel_buf).m_capacity < uVar1)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_pixel_buf,uVar1,true,4,(object_mover)0x0,false);
    }
    (this->m_pixel_buf).m_size = uVar1;
    __src = (this->m_pixel_buf).m_p;
    __n = (ulong)uVar6 << 2;
    memmove(__src + uVar6,__src,__n);
    memcpy((this->m_pixel_buf).m_p,pcVar5,__n);
  }
  else {
    if ((this->m_pixel_buf).m_capacity < uVar6) {
      this_00 = &this->m_pixel_buf;
      if (this_00->m_p != (color_quad<unsigned_char,_int> *)0x0) {
        crnlib_free(this_00->m_p);
        this_00->m_p = (color_quad<unsigned_char,_int> *)0x0;
        (this->m_pixel_buf).m_size = 0;
        (this->m_pixel_buf).m_capacity = 0;
        uVar6 = (other->m_pixel_buf).m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,uVar6,false,4,(object_mover)0x0,false);
    }
    else if ((this->m_pixel_buf).m_size != 0) {
      (this->m_pixel_buf).m_size = 0;
    }
    memcpy((this->m_pixel_buf).m_p,(other->m_pixel_buf).m_p,(ulong)(other->m_pixel_buf).m_size << 2)
    ;
    (this->m_pixel_buf).m_size = (other->m_pixel_buf).m_size;
  }
  pcVar5 = (this->m_pixel_buf).m_p;
LAB_0010903c:
  this->m_pPixels = pcVar5;
  uVar2 = other->m_height;
  uVar3 = other->m_pitch;
  uVar4 = other->m_total;
  this->m_width = other->m_width;
  this->m_height = uVar2;
  this->m_pitch = uVar3;
  this->m_total = uVar4;
  this->m_comp_flags = other->m_comp_flags;
  return this;
}

Assistant:

image& operator=(const image& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (other.m_pixel_buf.empty())
            {
                // This doesn't look very safe - let's make a new instance.
                //m_pixel_buf.clear();
                //m_pPixels = other.m_pPixels;

                const uint total_pixels = other.m_pitch * other.m_height;
                if ((total_pixels) && (other.m_pPixels))
                {
                    m_pixel_buf.resize(total_pixels);
                    m_pixel_buf.insert(0, other.m_pPixels, m_pixel_buf.size());
                    m_pPixels = &m_pixel_buf.front();
                }
                else
                {
                    m_pixel_buf.clear();
                    m_pPixels = nullptr;
                }
            }
            else
            {
                m_pixel_buf = other.m_pixel_buf;
                m_pPixels = &m_pixel_buf.front();
            }

            m_width = other.m_width;
            m_height = other.m_height;
            m_pitch = other.m_pitch;
            m_total = other.m_total;
            m_comp_flags = other.m_comp_flags;

            return *this;
        }